

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * parse_for_statement(dmr_C *C,token *token,statement *stmt)

{
  int iVar1;
  symbol *psVar2;
  symbol *local_48;
  statement *iterator;
  expression *e3;
  expression *e2;
  expression *e1;
  symbol_list *syms;
  statement *stmt_local;
  token *token_local;
  dmr_C *C_local;
  
  syms = (symbol_list *)stmt;
  stmt_local = (statement *)token;
  token_local = (token *)C;
  start_iterator(C,stmt);
  stmt_local = (statement *)
               dmrC_expect_token((dmr_C *)token_local,*(token **)&(stmt_local->pos).field_0x4,0x28,
                                 "after \'for\'");
  e1 = (expression *)0x0;
  e2 = (expression *)0x0;
  iVar1 = dmrC_lookup_type((token *)stmt_local);
  if (iVar1 == 0) {
    stmt_local = (statement *)dmrC_parse_expression((dmr_C *)token_local,(token *)stmt_local,&e2);
    stmt_local = (statement *)
                 dmrC_expect_token((dmr_C *)token_local,(token *)stmt_local,0x3b,"in \'for\'");
  }
  else {
    stmt_local = (statement *)
                 dmrC_external_declaration
                           ((dmr_C *)token_local,(token *)stmt_local,(symbol_list **)&e1,
                            validate_for_loop_decl);
  }
  stmt_local = (statement *)dmrC_parse_expression((dmr_C *)token_local,(token *)stmt_local,&e3);
  stmt_local = (statement *)
               dmrC_expect_token((dmr_C *)token_local,(token *)stmt_local,0x3b,"in \'for\'");
  stmt_local = (statement *)
               dmrC_parse_expression
                         ((dmr_C *)token_local,(token *)stmt_local,(expression **)&iterator);
  stmt_local = (statement *)
               dmrC_expect_token((dmr_C *)token_local,(token *)stmt_local,0x29,"in \'for\'");
  stmt_local = (statement *)
               statement((dmr_C *)token_local,(token *)stmt_local,(statement **)&local_48);
  syms->list_[0] = (symbol *)e1;
  psVar2 = (symbol *)make_statement((dmr_C *)token_local,e2);
  syms->list_[1] = psVar2;
  syms->list_[2] = (symbol *)e3;
  psVar2 = (symbol *)make_statement((dmr_C *)token_local,(expression *)iterator);
  syms->list_[4] = psVar2;
  syms->list_[5] = (symbol *)0x0;
  syms->list_[3] = local_48;
  end_iterator((dmr_C *)token_local,(statement *)syms);
  return (token *)stmt_local;
}

Assistant:

static struct token *parse_for_statement(struct dmr_C *C, struct token *token, struct statement *stmt)
{
	struct symbol_list *syms;
	struct expression *e1, *e2, *e3;
	struct statement *iterator;

	start_iterator(C, stmt);
	token = dmrC_expect_token(C, token->next, '(', "after 'for'");

	syms = NULL;
	e1 = NULL;
	/* C99 variable declaration? */
	if (dmrC_lookup_type(token)) {
		token = dmrC_external_declaration(C, token, &syms, validate_for_loop_decl);
	} else {
		token = dmrC_parse_expression(C, token, &e1);
		token = dmrC_expect_token(C, token, ';', "in 'for'");
	}
	token = dmrC_parse_expression(C, token, &e2);
	token = dmrC_expect_token(C, token, ';', "in 'for'");
	token = dmrC_parse_expression(C, token, &e3);
	token = dmrC_expect_token(C, token, ')', "in 'for'");
	token = statement(C, token, &iterator);

	stmt->iterator_syms = syms;
	stmt->iterator_pre_statement = make_statement(C, e1);
	stmt->iterator_pre_condition = e2;
	stmt->iterator_post_statement = make_statement(C, e3);
	stmt->iterator_post_condition = NULL;
	stmt->iterator_statement = iterator;
	end_iterator(C, stmt);

	return token;
}